

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveUpdateRightNoNZ(CLUFactor<double> *this,double *vec,double param_3)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long in_RSI;
  long in_RDI;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  double *val;
  double *lval;
  double x;
  int end;
  int k;
  int j;
  int i;
  int *local_58;
  double *local_40;
  int local_20;
  int local_1c;
  
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x29637a);
  lVar4 = *(long *)(in_RDI + 0x78);
  lVar5 = *(long *)(in_RDI + 0x98);
  lVar6 = *(long *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x88);
  for (local_1c = *(int *)(in_RDI + 0x84); local_1c < iVar2; local_1c = local_1c + 1) {
    dVar1 = *(double *)(in_RSI + (long)*(int *)(lVar5 + (long)local_1c * 4) * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar3 = *(int *)(lVar6 + (long)local_1c * 4);
      local_58 = (int *)(lVar4 + (long)iVar3 * 4);
      local_40 = pdVar7 + iVar3;
      for (local_20 = *(int *)(lVar6 + (long)(local_1c + 1) * 4); iVar3 < local_20;
          local_20 = local_20 + -1) {
        *(double *)(in_RSI + (long)*local_58 * 8) =
             *(double *)(in_RSI + (long)*local_58 * 8) - dVar1 * *local_40;
        local_58 = local_58 + 1;
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUpdateRightNoNZ(R* vec, R /*eps*/)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}